

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::lex(Lexer *this)

{
  pointer *__return_storage_ptr__;
  SyntaxTree *pSVar1;
  uint offset_00;
  bool bVar2;
  SyntaxKind SVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  SyntaxToken *pSVar10;
  ulong uVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  byte local_32a;
  byte local_26a;
  undefined1 auStack_218 [4];
  value_type idx_1;
  SyntaxTree *pSStack_210;
  size_t sStack_200;
  undefined8 local_1f8;
  anon_union_2_2_2d0bec1f_for_SyntaxToken_7 aStack_1f0;
  undefined2 uStack_1ee;
  uint uStack_1ec;
  anon_union_8_8_afa5da80_for_SyntaxToken_12 local_1e8;
  pair<unsigned_int,_unsigned_int> local_1d8;
  pair<unsigned_int,_unsigned_int> *local_1d0;
  pair<unsigned_int,_unsigned_int> *p;
  bool isGenerated;
  value_type vStack_1c0;
  bool isExpanded;
  value_type idx;
  string local_1b8;
  TextElement *local_198;
  StringLiteral *fileName;
  unsigned_long lineno_1;
  unsigned_long local_180;
  pair<unsigned_int,_unsigned_int> local_178;
  ulong local_170;
  unsigned_long column;
  unsigned_long lineno;
  pair<int,_int> local_158;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_150;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_148;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_140;
  size_type local_138;
  size_type prevSize;
  unsigned_long all;
  undefined1 auStack_120 [4];
  uint32_t offset;
  SyntaxToken tk;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> braces;
  undefined1 local_90 [4];
  uint curExpansionIdx;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  expansions;
  SyntaxToken local_48;
  Lexer *local_10;
  Lexer *this_local;
  
  pSVar1 = this->tree_;
  local_10 = this;
  SyntaxToken::SyntaxToken(&local_48,(SyntaxTree *)0x0);
  SyntaxTree::addToken(pSVar1,&local_48);
  SyntaxToken::~SyntaxToken(&local_48);
  pSVar1 = this->tree_;
  __return_storage_ptr__ =
       &expansions.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SyntaxTree::filePath_abi_cxx11_((string *)__return_storage_ptr__,pSVar1);
  SyntaxTree::relayLineDirective(pSVar1,0,1,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string
            ((string *)
             &expansions.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SyntaxTree::relayLineStart(this->tree_,0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_90);
  braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)
             &tk.field_10);
  SyntaxToken::SyntaxToken((SyntaxToken *)auStack_120,this->tree_);
LAB_003f69eb:
  yylex(this,(SyntaxToken *)auStack_120);
LAB_003f6a02:
  do {
    bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
    if ((!bVar2) || (bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,HashToken), !bVar2))
    break;
    all._4_4_ = tk._12_4_;
    yylex(this,(SyntaxToken *)auStack_120);
    bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
    if ((!bVar2) && (bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,IdentifierToken), bVar2)
       ) {
      pcVar6 = TextElement::c_str((TextElement *)tk._40_8_);
      iVar4 = strcmp(pcVar6,"expansion");
      if (iVar4 == 0) {
        yylex(this,(SyntaxToken *)auStack_120);
        bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
        if ((!bVar2) &&
           (bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,IdentifierToken), bVar2)) {
          pcVar6 = TextElement::c_str((TextElement *)tk._40_8_);
          iVar4 = strcmp(pcVar6,"begin");
          if (iVar4 == 0) {
            yylex(this,(SyntaxToken *)auStack_120);
            yylex(this,(SyntaxToken *)auStack_120);
            yylex(this,(SyntaxToken *)auStack_120);
            yylex(this,(SyntaxToken *)auStack_120);
            while( true ) {
              bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,EndOfFile);
              local_26a = 0;
              if (!bVar2) {
                bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
                local_26a = bVar2 ^ 0xff;
              }
              if ((local_26a & 1) == 0) break;
              bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,OperatorName_COMPLToken);
              if (bVar2) {
                yylex(this,(SyntaxToken *)auStack_120);
                pcVar6 = SyntaxToken::valueText_c_str((SyntaxToken *)auStack_120);
                prevSize = strtoul(pcVar6,(char **)0x0,0);
                local_138 = std::
                            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)local_90);
                std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::resize((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          *)local_90,local_138 + prevSize);
                local_148._M_current =
                     (pair<unsigned_int,_unsigned_int> *)
                     std::
                     vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              *)local_90);
                local_140 = __gnu_cxx::
                            __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                            ::operator+(&local_148,local_138);
                local_150._M_current =
                     (pair<unsigned_int,_unsigned_int> *)
                     std::
                     vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            *)local_90);
                lineno._4_4_ = 0;
                lineno._0_4_ = 0;
                local_158 = std::make_pair<int,int>((int *)((long)&lineno + 4),(int *)&lineno);
                std::
                fill<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,std::pair<int,int>>
                          (local_140,local_150,&local_158);
                yylex(this,(SyntaxToken *)auStack_120);
              }
              else {
                bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,IntegerConstantToken);
                if (bVar2) {
                  pcVar6 = SyntaxToken::valueText_c_str((SyntaxToken *)auStack_120);
                  column = strtoul(pcVar6,(char **)0x0,0);
                  yylex(this,(SyntaxToken *)auStack_120);
                  yylex(this,(SyntaxToken *)auStack_120);
                  pcVar6 = SyntaxToken::valueText_c_str((SyntaxToken *)auStack_120);
                  local_170 = strtoul(pcVar6,(char **)0x0,0);
                  yylex(this,(SyntaxToken *)auStack_120);
                  pVar12 = std::make_pair<unsigned_long&,unsigned_long&>(&column,&local_170);
                  local_180 = pVar12.second;
                  lineno_1 = pVar12.first;
                  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_long,_unsigned_long,_true>
                            (&local_178,(pair<unsigned_long,_unsigned_long> *)&lineno_1);
                  std::
                  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               *)local_90,&local_178);
                }
              }
            }
          }
          else {
            pcVar6 = TextElement::c_str((TextElement *)tk._40_8_);
            iVar4 = strcmp(pcVar6,"end");
            if (iVar4 == 0) {
              std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::clear((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_90);
              braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
              yylex(this,(SyntaxToken *)auStack_120);
            }
          }
        }
        goto LAB_003f6a02;
      }
    }
    bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
    if ((!bVar2) && (bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,IdentifierToken), bVar2)
       ) {
      pcVar6 = TextElement::c_str((TextElement *)tk._40_8_);
      iVar4 = strcmp(pcVar6,"line");
      if (iVar4 == 0) {
        yylex(this,(SyntaxToken *)auStack_120);
      }
    }
    bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
    if ((!bVar2) &&
       (bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,IntegerConstantToken), bVar2)) {
      pcVar6 = SyntaxToken::valueText_c_str((SyntaxToken *)auStack_120);
      fileName = (StringLiteral *)strtoul(pcVar6,(char **)0x0,0);
      yylex(this,(SyntaxToken *)auStack_120);
      bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
      if ((!bVar2) &&
         (bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,StringLiteralToken), bVar2)) {
        pSVar1 = this->tree_;
        pcVar6 = TextElement::c_str((TextElement *)tk._40_8_);
        uVar5 = TextElement::size((TextElement *)tk._40_8_);
        local_198 = (TextElement *)SyntaxTree::findOrInsertStringLiteral(pSVar1,pcVar6,uVar5);
        offset_00 = all._4_4_;
        pSVar1 = this->tree_;
        uVar5 = (uint)fileName;
        pcVar6 = TextElement::c_str(local_198);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,pcVar6,(allocator<char> *)((long)&idx + 3));
        SyntaxTree::relayLineDirective(pSVar1,offset_00,uVar5,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&idx + 3));
        yylex(this,(SyntaxToken *)auStack_120);
      }
    }
    while( true ) {
      bVar2 = SyntaxToken::isAtStartOfLine((SyntaxToken *)auStack_120);
      local_32a = 0;
      if (!bVar2) {
        bVar2 = SyntaxToken::isKind((SyntaxToken *)auStack_120,EndOfFile);
        local_32a = bVar2 ^ 0xff;
      }
      if ((local_32a & 1) == 0) break;
      yylex(this,(SyntaxToken *)auStack_120);
    }
  } while( true );
  SVar3 = SyntaxToken::kind((SyntaxToken *)auStack_120);
  if (SVar3 == OpenBraceToken) {
    sVar7 = SyntaxTree::tokenCount(this->tree_);
    vStack_1c0 = (value_type)sVar7;
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &tk.field_10,&stack0xfffffffffffffe40);
  }
  else {
    SVar3 = SyntaxToken::kind((SyntaxToken *)auStack_120);
    if ((SVar3 != CloseBraceToken) ||
       (bVar2 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)&tk.field_10), bVar2)) {
      bVar2 = SyntaxToken::isComment((SyntaxToken *)auStack_120);
      if (bVar2) {
        std::vector<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>::push_back
                  (&this->tree_->comments_,(value_type *)auStack_120);
        SVar3 = SyntaxToken::kind((SyntaxToken *)auStack_120);
        if (SVar3 != Keyword_ExtPSY_omission) goto LAB_003f760b;
      }
    }
    else {
      pvVar9 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &tk.field_10);
      p._4_4_ = *pvVar9;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &tk.field_10);
      uVar11 = (ulong)p._4_4_;
      sVar7 = SyntaxTree::tokenCount(this->tree_);
      if (uVar11 < sVar7) {
        sVar7 = SyntaxTree::tokenCount(this->tree_);
        pSVar10 = SyntaxTree::tokenAt(this->tree_,(ulong)p._4_4_);
        pSVar10->matchingBracket_ = sVar7;
      }
    }
  }
  p._3_1_ = 0;
  p._2_1_ = 0;
  bVar2 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::empty((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_90);
  if ((!bVar2) &&
     (sVar8 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)local_90),
     braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Deque_impl_data._M_finish._M_node._4_4_ < sVar8)) {
    p._3_1_ = 1;
    local_1d0 = std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              *)local_90,
                             (ulong)braces.c.
                                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
    if (local_1d0->first == 0) {
      p._2_1_ = 1;
    }
    else {
      pSVar1 = this->tree_;
      uVar5 = SyntaxToken::charStart((SyntaxToken *)auStack_120);
      local_1d8 = *local_1d0;
      SyntaxTree::relayExpansion(pSVar1,uVar5,local_1d8);
    }
    braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node._4_4_ =
         braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node._4_4_ + 1;
  }
  tk.matchingBracket_._0_1_ =
       (byte)tk.matchingBracket_ & 0xe7 | (p._3_1_ & 1) << 3 | (p._2_1_ & 1) << 4;
  local_1e8 = (anon_union_8_8_afa5da80_for_SyntaxToken_12)tk._40_8_;
  local_1f8._1_7_ = tk.matchingBracket_._1_7_;
  local_1f8._0_1_ = (byte)tk.matchingBracket_;
  aStack_1f0 = tk.field_7;
  uStack_1ee = tk._34_2_;
  uStack_1ec = tk.lineno_;
  sStack_200._0_4_ = tk.byteOffset_;
  sStack_200._4_4_ = tk.charOffset_;
  _auStack_218 = _auStack_120;
  pSStack_210 = tk.tree_;
  SyntaxTree::addToken(this->tree_,(SyntaxToken *)auStack_218);
  SyntaxToken::~SyntaxToken((SyntaxToken *)auStack_218);
LAB_003f760b:
  SVar3 = SyntaxToken::kind((SyntaxToken *)auStack_120);
  if (SVar3 == EndOfFile) {
    while (bVar2 = std::
                   stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                   empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&tk.field_10), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar9 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &tk.field_10);
      uVar5 = *pvVar9;
      sVar7 = SyntaxTree::tokenCount(this->tree_);
      pSVar10 = SyntaxTree::tokenAt(this->tree_,(ulong)uVar5);
      pSVar10->matchingBracket_ = sVar7;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &tk.field_10);
    }
    SyntaxToken::~SyntaxToken((SyntaxToken *)auStack_120);
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &tk.field_10);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)local_90);
    return;
  }
  goto LAB_003f69eb;
}

Assistant:

void Lexer::lex()
{
    // Marker (invalid) token.
    tree_->addToken(SyntaxToken(nullptr));

    // Line and column...
    tree_->relayLineDirective(0, 1, tree_->filePath());
    tree_->relayLineStart(0);
    std::vector<std::pair<unsigned int, unsigned int>> expansions;
    unsigned int curExpansionIdx = 0;

    // SyntaxKind::Open/close brace tracking.
    std::stack<unsigned> braces;

    SyntaxToken tk(tree_);

    do {
        yylex(&tk);

LexEntry:
        if (tk.isAtStartOfLine() && tk.isKind(SyntaxKind::HashToken)) {
            auto offset = tk.charOffset_;
            yylex(&tk);

            if (!tk.isAtStartOfLine()
                    && tk.isKind(SyntaxKind::IdentifierToken)
                    && !strcmp(tk.identifier_->c_str(), kExpansion)) {
                // A Qt Creator-specific macro mark.
                yylex(&tk);

                if (!tk.isAtStartOfLine() && tk.isKind(SyntaxKind::IdentifierToken)) {
                    if (!strcmp(tk.identifier_->c_str(), kBegin)) {
                        // The start of an expansion section.
                        yylex(&tk);

                        // Gather where it happens and its length.
                        yylex(&tk);
                        yylex(&tk); // Skip the separating comma.
                        yylex(&tk);

                        // Gather the real line and column from the upcoming tokens; only
                        // relevant for tokens which are expanded but not generated.
                        while (!tk.isKind(SyntaxKind::EndOfFile)
                                    && !tk.isAtStartOfLine()) {
                            // A ~ means that the a number of generated tokens follows;
                            // otherwise, what follows is data.
                            if (tk.isKind(SyntaxKind::TildeToken)) {
                                yylex(&tk);

                                // Get the total number of generated tokens and specify "null"
                                // information for them.
                                auto all = strtoul(tk.valueText_c_str(), 0, 0);
                                auto prevSize = expansions.size();
                                expansions.resize(prevSize + all);
                                std::fill(expansions.begin() + prevSize,
                                          expansions.end(),
                                          std::make_pair(0, 0));

                                yylex(&tk);
                            }
                            else if (tk.isKind(SyntaxKind::IntegerConstantToken)) {
                                auto lineno = strtoul(tk.valueText_c_str(), 0, 0);
                                yylex(&tk);
                                yylex(&tk); // Skip the separating colon.
                                auto column = strtoul(tk.valueText_c_str(), 0, 0);
                                yylex(&tk);

                                // Store line and column for this non-generated token.
                                expansions.push_back(std::make_pair(lineno, column));
                            }
                        }
                    }
                    else if (!strcmp(tk.identifier_->c_str(), kEnd)) {
                        // The end of an expansion section.
                        expansions.clear();
                        curExpansionIdx = 0;
                        yylex(&tk);
                    }
                }
            }
            else {
                // A regular preprocessor directive.
                if (!tk.isAtStartOfLine()
                        && tk.isKind(SyntaxKind::IdentifierToken)
                        && !strcmp(tk.identifier_->c_str(), kLine)) {
                    yylex(&tk);
                }

                if (!tk.isAtStartOfLine()
                        && tk.isKind(SyntaxKind::IntegerConstantToken)) {
                    auto lineno = strtoul(tk.valueText_c_str(), 0, 0);
                    yylex(&tk);

                    if (!tk.isAtStartOfLine()
                            && tk.isKind(SyntaxKind::StringLiteralToken)) {
                        auto fileName = tree_->findOrInsertStringLiteral(tk.string_->c_str(), tk.string_->size());
                        tree_->relayLineDirective(offset, lineno, fileName->c_str());
                        yylex(&tk);
                    }
                }

                while (!tk.isAtStartOfLine() && !tk.isKind(SyntaxKind::EndOfFile)) {
                    // Skip the remaining of the line, ignoring a possible include.
                    yylex(&tk);
                }
            }
            goto LexEntry;
        }
        else if (tk.kind() == SyntaxKind::OpenBraceToken) {
            braces.push(tree_->tokenCount());
        }
        else if (tk.kind() == SyntaxKind::CloseBraceToken && !braces.empty()) {
            auto idx = braces.top();
            braces.pop();
            if (idx < tree_->tokenCount())
                tree_->tokenAt(idx).matchingBracket_ = tree_->tokenCount();
        }
        else if (tk.isComment()) {
            tree_->comments_.push_back(tk);
            if (tk.kind() != SyntaxKind::Keyword_ExtPSY_omission)
                continue;
        }

        bool isExpanded = false;
        bool isGenerated = false;
        if (!expansions.empty() && curExpansionIdx < expansions.size()) {
            isExpanded = true;
            const std::pair<unsigned int, unsigned int>& p = expansions[curExpansionIdx];
            if (p.first)
                tree_->relayExpansion(tk.charStart(), p);
            else
                isGenerated = true;
            ++curExpansionIdx;
        }
        tk.BF_.expanded_ = isExpanded;
        tk.BF_.generated_ = isGenerated;

        tree_->addToken(tk);
    }
    while (tk.kind() != SyntaxKind::EndOfFile);

    for (; !braces.empty(); braces.pop()) {
        auto idx = braces.top();
        tree_->tokenAt(idx).matchingBracket_ = tree_->tokenCount();
    }
}